

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TreeNodeExV(char *str_id,ImGuiTreeNodeFlags flags,char *fmt,__va_list_tag *args)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id;
  char *label_end;
  char *label;
  char *local_38;
  char *local_30;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  this = pIVar1->CurrentWindow;
  if (this->SkipItems == false) {
    ImFormatStringToTempBufferV(&local_30,&local_38,fmt,args);
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    bVar2 = TreeNodeBehavior(id,flags,local_30,local_38);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::TreeNodeExV(const char* str_id, ImGuiTreeNodeFlags flags, const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const char* label, *label_end;
    ImFormatStringToTempBufferV(&label, &label_end, fmt, args);
    return TreeNodeBehavior(window->GetID(str_id), flags, label, label_end);
}